

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessDomain
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference aLhs;
  StringArray *this_01;
  element_type *peVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  anon_class_1_0_00000001 local_9aa;
  v10 local_9a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  char *local_9a0;
  string local_998;
  Error local_978;
  Value local_950;
  string_t local_908;
  Value local_8e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_8a0;
  anon_class_1_0_00000001 local_88a;
  v10 local_889;
  v10 *local_888;
  size_t local_880;
  string local_878;
  Error local_858;
  Value local_830;
  int local_7e8;
  anon_class_1_0_00000001 local_7e2;
  v10 local_7e1;
  v10 *local_7e0;
  size_t local_7d8;
  string local_7d0;
  Error local_7b0;
  Value local_788;
  allocator local_739;
  string local_738;
  string local_718;
  reference local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias_1;
  iterator __end4;
  iterator __begin4;
  StringArray *__range4;
  StringArray unresolved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b8;
  char *local_6b0;
  string local_6a8;
  Error local_688;
  Value local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  iterator __end3;
  iterator __begin3;
  StringArray *__range3;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  domains;
  json json;
  undefined1 local_5c8 [6];
  RegistryStatus status;
  anon_class_1_0_00000001 local_5a2;
  v10 local_5a1;
  v10 *local_5a0;
  size_t local_598;
  string local_590;
  Error local_570;
  Value local_548;
  anon_class_1_0_00000001 local_4ea;
  v10 local_4e9;
  v10 *local_4e8;
  size_t local_4e0;
  string local_4d8;
  Error local_4b8;
  Value local_490;
  byte local_441;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_440;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_410 [16];
  v10 *local_400;
  ulong local_3f8;
  v10 *local_3f0;
  size_t sStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3d8 [3];
  undefined1 local_3c0 [16];
  v10 *local_3b0;
  ulong local_3a8;
  v10 *local_3a0;
  size_t sStack_398;
  string *local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_388 [3];
  undefined1 local_370 [16];
  v10 *local_360;
  ulong local_358;
  v10 *local_350;
  size_t sStack_348;
  string *local_340;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_338 [3];
  undefined1 local_320 [16];
  v10 *local_310;
  ulong local_308;
  v10 *local_300;
  size_t sStack_2f8;
  string *local_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8 [2];
  undefined1 local_2d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  char *local_2c0;
  const_reference local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  char *pcStack_2a8;
  string *local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_298 [3];
  undefined1 local_280 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  char *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *pcStack_250;
  string *local_248;
  v10 *local_240;
  v10 **local_238;
  v10 *local_230;
  v10 **local_228;
  v10 *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_218;
  v10 *local_210;
  v10 **local_208;
  v10 *local_200;
  v10 **local_1f8;
  v10 *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1e8;
  v10 **local_1e0;
  v10 *local_1d8;
  size_t sStack_1d0;
  v10 **local_1c0;
  v10 *local_1b8;
  size_t sStack_1b0;
  v10 **local_1a0;
  v10 *local_198;
  size_t sStack_190;
  v10 **local_180;
  v10 *local_178;
  size_t sStack_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  undefined1 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_140;
  undefined1 *local_138;
  Value **local_130;
  undefined1 *local_128;
  Value **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_108;
  Value **local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_441 = 0;
  local_440 = aExpr;
  aExpr_local = (Expression *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_440);
  if (sVar2 < 2) {
    ProcessDomain::anon_class_1_0_00000001::operator()(&local_4ea);
    local_238 = &local_4e8;
    local_240 = &local_4e9;
    bVar4 = ::fmt::v10::operator()(local_240);
    local_4e0 = bVar4.size_;
    local_4e8 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_2f0 = &local_4d8;
    local_300 = local_4e8;
    sStack_2f8 = local_4e0;
    local_1e0 = &local_300;
    local_310 = local_4e8;
    local_308 = local_4e0;
    local_1d8 = local_310;
    sStack_1d0 = local_308;
    local_338[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_158 = local_320;
    local_160 = local_338;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_308;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_160;
    local_108 = local_160;
    local_b8 = local_160;
    local_a8 = local_158;
    ::fmt::v10::vformat_abi_cxx11_(&local_4d8,local_310,fmt,args);
    Error::Error(&local_4b8,kInvalidArgs,&local_4d8);
    Value::Value(&local_490,&local_4b8);
    Value::operator=(__return_storage_ptr__,&local_490);
    Value::~Value(&local_490);
    Error::~Error(&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_440);
    if (sVar2 == 2) {
      aLhs = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_440,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_5c8,"list",(allocator *)((long)&json.m_value + 7));
      bVar1 = CaseInsensitiveEqual(aLhs,(string *)local_5c8);
      std::__cxx11::string::~string((string *)local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&json.m_value + 7));
      if (bVar1) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&domains.
                         super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  *)&__range3);
        this_01 = &(this->mContext).mDomAliases;
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_01);
        alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&alias), bVar1) {
          local_618 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          bVar1 = std::operator==(local_618,"all");
          if ((bVar1) || (bVar1 = std::operator==(local_618,"other"), bVar1)) {
            ProcessDomain::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       ((long)&unresolved.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
            local_218 = &local_6b8;
            local_220 = (v10 *)((long)&unresolved.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            bVar4 = ::fmt::v10::operator()(local_220);
            local_6b0 = (char *)bVar4.size_;
            local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        bVar4.data_;
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            local_248 = &local_6a8;
            local_258 = local_6b8;
            pcStack_250 = local_6b0;
            local_260 = local_618;
            local_a0 = &local_258;
            local_270 = local_6b8;
            local_268 = local_6b0;
            local_98 = local_270;
            pcStack_90 = local_268;
            local_298[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_618,(v10 *)local_248,local_6b8);
            local_60 = local_280;
            local_68 = local_298;
            local_50 = 0xd;
            fmt_01.size_ = 0xd;
            fmt_01.data_ = local_268;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_68;
            local_58 = local_68;
            local_48 = local_60;
            local_10 = local_68;
            ::fmt::v10::vformat_abi_cxx11_(&local_6a8,(v10 *)local_270,fmt_01,args_01);
            Error::Error(&local_688,kInvalidArgs,&local_6a8);
            Value::Value(&local_660,&local_688);
            Value::operator=(__return_storage_ptr__,&local_660);
            Value::~Value(&local_660);
            Error::~Error(&local_688);
            std::__cxx11::string::~string((string *)&local_6a8);
            local_7e8 = 4;
            goto LAB_0030b720;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->mContext).mDomAliases);
        if (sVar2 == 0) {
          peVar3 = std::
                   __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mRegistry);
          json.m_value.number_unsigned._6_1_ =
               persistent_storage::Registry::GetAllDomains(peVar3,(DomainArray *)&__range3);
          if ((json.m_value.number_integer._6_1_ == kSuccess) ||
             (json.m_value.number_integer._6_1_ == kNotFound)) goto LAB_0030b66f;
          ProcessDomain::anon_class_1_0_00000001::operator()(&local_88a);
          local_1f8 = &local_888;
          local_200 = &local_889;
          bVar4 = ::fmt::v10::operator()(local_200);
          local_880 = bVar4.size_;
          local_888 = (v10 *)bVar4.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_3e0 = &local_878;
          local_3f0 = local_888;
          sStack_3e8 = local_880;
          local_180 = &local_3f0;
          local_400 = local_888;
          local_3f8 = local_880;
          local_178 = local_400;
          sStack_170 = local_3f8;
          value = (Value *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_128 = local_410;
          local_130 = &value;
          local_f8 = 0;
          fmt_03.size_ = 0;
          fmt_03.data_ = (char *)local_3f8;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_130;
          local_120 = local_130;
          local_100 = local_130;
          local_f0 = local_128;
          ::fmt::v10::vformat_abi_cxx11_(&local_878,local_400,fmt_03,args_03);
          Error::Error(&local_858,kRegistryError,&local_878);
          Value::Value(&local_830,&local_858);
          Value::operator=(__return_storage_ptr__,&local_830);
          Value::~Value(&local_830);
          Error::~Error(&local_858);
          std::__cxx11::string::~string((string *)&local_878);
          local_7e8 = 4;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range4);
          peVar3 = std::
                   __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mRegistry);
          json.m_value.number_unsigned._6_1_ =
               persistent_storage::Registry::GetDomainsByAliases
                         (peVar3,&(this->mContext).mDomAliases,(DomainArray *)&__range3,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range4);
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range4);
          alias_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range4);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&alias_1), bVar1) {
            local_6f8 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
            std::__cxx11::string::string((string *)&local_718,(string *)local_6f8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_738,"failed to resolve",&local_739);
            PrintNetworkMessage(this,&local_718,&local_738,kYellow);
            std::__cxx11::string::~string((string *)&local_738);
            std::allocator<char>::~allocator((allocator<char> *)&local_739);
            std::__cxx11::string::~string((string *)&local_718);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          if (json.m_value.number_integer._6_1_ == '\0') {
            local_7e8 = 0;
          }
          else {
            ProcessDomain::anon_class_1_0_00000001::operator()(&local_7e2);
            local_208 = &local_7e0;
            local_210 = &local_7e1;
            bVar4 = ::fmt::v10::operator()(local_210);
            local_7d8 = bVar4.size_;
            local_7e0 = (v10 *)bVar4.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_390 = &local_7d0;
            local_3a0 = local_7e0;
            sStack_398 = local_7d8;
            local_1a0 = &local_3a0;
            local_3b0 = local_7e0;
            local_3a8 = local_7d8;
            local_198 = local_3b0;
            sStack_190 = local_3a8;
            local_3d8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_138 = local_3c0;
            local_140 = local_3d8;
            local_e0 = 0;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_3a8;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_140;
            local_118 = local_140;
            local_e8 = local_140;
            local_d8 = local_138;
            ::fmt::v10::vformat_abi_cxx11_(&local_7d0,local_3b0,fmt_02,args_02);
            Error::Error(&local_7b0,kRegistryError,&local_7d0);
            Value::Value(&local_788,&local_7b0);
            Value::operator=(__return_storage_ptr__,&local_788);
            Value::~Value(&local_788);
            Error::~Error(&local_7b0);
            std::__cxx11::string::~string((string *)&local_7d0);
            local_7e8 = 4;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range4);
          if (local_7e8 == 0) {
LAB_0030b66f:
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_&,_std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>,_0>
                      (&local_8a0,
                       (vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        *)&__range3);
            this_00 = &domains.
                       super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)this_00,&local_8a0);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_8a0);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_908,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)this_00,4,' ',false,strict);
            Value::Value(&local_8e8,&local_908);
            Value::operator=(__return_storage_ptr__,&local_8e8);
            Value::~Value(&local_8e8);
            std::__cxx11::string::~string((string *)&local_908);
            local_7e8 = 0;
          }
        }
LAB_0030b720:
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::~vector((vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   *)&__range3);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&domains.
                          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((local_7e8 != 0) && (local_7e8 != 4)) goto LAB_0030b9d4;
      }
      else {
        ProcessDomain::anon_class_1_0_00000001::operator()(&local_9aa);
        local_1e8 = &local_9a8;
        local_1f0 = &local_9a9;
        bVar4 = ::fmt::v10::operator()(local_1f0);
        local_9a0 = (char *)bVar4.size_;
        local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_2b8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_440,1);
        local_2a0 = &local_998;
        local_2b0 = local_9a8;
        pcStack_2a8 = local_9a0;
        local_80 = &local_2b0;
        local_2c8 = local_9a8;
        local_2c0 = local_9a0;
        local_78 = local_2c8;
        pcStack_70 = local_2c0;
        local_2e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2b8,(v10 *)local_2a0,local_9a8);
        local_38 = local_2d8;
        local_40 = local_2e8;
        local_28 = 0xd;
        fmt_04.size_ = 0xd;
        fmt_04.data_ = local_2c0;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)local_40;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        ::fmt::v10::vformat_abi_cxx11_(&local_998,(v10 *)local_2c8,fmt_04,args_04);
        Error::Error(&local_978,kInvalidCommand,&local_998);
        Value::Value(&local_950,&local_978);
        Value::operator=(__return_storage_ptr__,&local_950);
        Value::~Value(&local_950);
        Error::~Error(&local_978);
        std::__cxx11::string::~string((string *)&local_998);
      }
    }
    else {
      ProcessDomain::anon_class_1_0_00000001::operator()(&local_5a2);
      local_228 = &local_5a0;
      local_230 = &local_5a1;
      bVar4 = ::fmt::v10::operator()(local_230);
      local_598 = bVar4.size_;
      local_5a0 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_340 = &local_590;
      local_350 = local_5a0;
      sStack_348 = local_598;
      local_1c0 = &local_350;
      local_360 = local_5a0;
      local_358 = local_598;
      local_1b8 = local_360;
      sStack_1b0 = local_358;
      local_388[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_148 = local_370;
      local_150 = local_388;
      local_c8 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_358;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_150;
      local_110 = local_150;
      local_d0 = local_150;
      local_c0 = local_148;
      ::fmt::v10::vformat_abi_cxx11_(&local_590,local_360,fmt_00,args_00);
      Error::Error(&local_570,kInvalidArgs,&local_590);
      Value::Value(&local_548,&local_570);
      Value::operator=(__return_storage_ptr__,&local_548);
      Value::~Value(&local_548);
      Error::~Error(&local_570);
      std::__cxx11::string::~string((string *)&local_590);
    }
  }
  local_441 = 1;
  local_7e8 = 1;
LAB_0030b9d4:
  if ((local_441 & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessDomain(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() > 1, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        RegistryStatus      status;
        nlohmann::json      json;
        std::vector<Domain> domains;

        for (const auto &alias : mContext.mDomAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                ExitNow(value = ERROR_INVALID_ARGS("alias '{}' not supported by the command", alias));
            }
        }
        if (mContext.mDomAliases.size() != 0)
        {
            StringArray unresolved;
            status = mRegistry->GetDomainsByAliases(mContext.mDomAliases, domains, unresolved);
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllDomains(domains);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        json  = domains;
        value = json.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}